

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O0

void __thiscall PluginFverb::clear(PluginFverb *this)

{
  pointer this_00;
  reference pvVar1;
  uint local_1c;
  FractionTop local_18;
  uint32_t ch;
  PluginFverb *local_10;
  PluginFverb *this_local;
  
  local_10 = this;
  this_00 = std::unique_ptr<Fverb,_std::default_delete<Fverb>_>::operator->(&this->fDsp);
  Fverb::clear(this_00);
  LinearSmoother::clearToTarget(&this->fDry);
  LinearSmoother::clearToTarget(&this->fWet);
  WDL_Resampler::FractionTop::FractionTop((FractionTop *)&ch,0);
  WDL_Resampler::Reset(&this->fDownsampler,(FractionTop)ch);
  WDL_Resampler::FractionTop::FractionTop(&local_18,0);
  WDL_Resampler::Reset(&this->fUpsampler,local_18);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    pvVar1 = std::array<float,_2UL>::operator[](&this->fLastDspOutputs,(ulong)local_1c);
    *pvVar1 = 0.0;
  }
  return;
}

Assistant:

void PluginFverb::clear()
{
    fDsp->clear();

    fDry.clearToTarget();
    fWet.clearToTarget();

    fDownsampler.Reset();
    fUpsampler.Reset();

    for (uint32_t ch = 0; ch < kNumChannels; ++ch)
        fLastDspOutputs[ch] = 0;
}